

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Contact *ct)

{
  bool bVar1;
  ostream *out_00;
  type addr;
  Contact *ct_local;
  ostream *out_local;
  
  std::operator<<(out,(string *)ct);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ct->work_address);
  if (bVar1) {
    out_00 = std::operator<<(out,", ");
    addr = std::unique_ptr<Address,_std::default_delete<Address>_>::operator*(&ct->work_address);
    operator<<(out_00,addr);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Contact& ct)
	{
		out << ct.name;
		if(ct.work_address)
		{
			out << ", " << *ct.work_address;
		}

		return out;
	}